

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void ndiSetThreadMode(ndicapi *pol,bool mode)

{
  char *pcVar1;
  pthread_mutex_t *ppVar2;
  pl_cond_and_mutex_t *ppVar3;
  pthread_t pVar4;
  
  if (pol->IsThreadedMode != mode) {
    pol->IsThreadedMode = mode;
    if (mode) {
      pcVar1 = (char *)malloc(0x800);
      pol->ThreadCommand = pcVar1;
      *pcVar1 = '\0';
      pcVar1 = (char *)malloc(0x800);
      pol->ThreadReply = pcVar1;
      *pcVar1 = '\0';
      pcVar1 = (char *)malloc(0x800);
      pol->ThreadBuffer = pcVar1;
      *pcVar1 = '\0';
      pol->ThreadErrorCode = 0;
      ppVar2 = ndiMutexCreate();
      pol->ThreadBufferMutex = ppVar2;
      ppVar3 = ndiEventCreate();
      pol->ThreadBufferEvent = ppVar3;
      ppVar2 = ndiMutexCreate();
      pol->ThreadMutex = ppVar2;
      if (pol->IsTracking == false) {
        ndiMutexLock(ppVar2);
      }
      pVar4 = ndiThreadSplit(ndiThreadFunc,pol);
      pol->Thread = pVar4;
    }
    else {
      if (pol->IsTracking == false) {
        ndiMutexUnlock(pol->ThreadMutex);
      }
      ndiThreadJoin(pol->Thread);
      ndiEventDestroy(pol->ThreadBufferEvent);
      ndiMutexDestroy(pol->ThreadBufferMutex);
      ndiMutexDestroy(pol->ThreadMutex);
      free(pol->ThreadBuffer);
      pol->ThreadBuffer = (char *)0x0;
      free(pol->ThreadReply);
      pol->ThreadReply = (char *)0x0;
      free(pol->ThreadCommand);
      pol->ThreadCommand = (char *)0x0;
    }
  }
  return;
}

Assistant:

ndicapiExport void ndiSetThreadMode(ndicapi* pol, bool mode)
{
  if ((pol->IsThreadedMode && mode) || (!pol->IsThreadedMode && !mode))
  {
    return;
  }

  pol->IsThreadedMode = mode;

  if (mode)
  {
    ndiSpawnThread(pol);
  }
  else
  {
    ndiJoinThread(pol);
  }
}